

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O2

void __thiscall iutest::any::any(any *this,char *rhs)

{
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,rhs,&local_39);
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::holder
            (this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->content = (placeholder *)this_00;
  return;
}

Assistant:

any(const char rhs[]) : content(new holder< ::std::string >(::std::string(rhs)) ) {}